

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O1

RK_S32 __thiscall MppMemService::chk_poison(MppMemService *this,MppMemNode *node)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  RK_S32 RVar6;
  ulong uVar7;
  
  RVar6 = 0;
  if ((this->debug & 0x20) != 0) {
    uVar4 = (uint)node->size;
    RVar6 = 0;
    if ((int)uVar4 < 0x400) {
      if ((int)uVar4 < 1) {
        uVar5 = 0xffffffff;
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = 0xffffffff;
        uVar2 = 0;
        uVar5 = 0xffffffff;
        do {
          uVar3 = (uint)uVar2;
          if (-1 < (int)(uint)uVar5) {
            uVar3 = (uint)uVar5;
          }
          pcVar1 = (char *)((long)node->ptr + uVar2);
          uVar2 = uVar2 + 1;
          if (*pcVar1 != -0x23) {
            uVar5 = (ulong)uVar3;
            uVar7 = uVar2 & 0xffffffff;
          }
        } while ((uVar4 & 0x7fffffff) != uVar2);
      }
      if ((-1 < (int)uVar5) || (-1 < (int)uVar7)) {
        _mpp_log_l(2,"mpp_mem","found memory %p size %d caller %s overwrite from %d to %d\n",
                   "chk_poison",node->ptr,node->size,node->caller,uVar5,uVar7);
        dump(this,node->caller);
      }
      RVar6 = (int)uVar7 - (int)uVar5;
    }
  }
  return RVar6;
}

Assistant:

RK_S32 MppMemService::chk_poison(MppMemNode *node)
{
    if ((debug & MEM_POISON) == 0)
        return 0;

    // check oldest memory and free it
    RK_U8 *node_ptr = (RK_U8 *)node->ptr;
    RK_S32 size = node->size;
    RK_S32 i = 0;
    RK_S32 start = -1;
    RK_S32 end = -1;

    if (size >= 1024)
        return 0;

    for (; i < size; i++) {
        if (node_ptr[i] != MEM_CHECK_MARK) {
            if (start < 0) {
                start = i;
            }
            end = i + 1;
        }
    }

    if (start >= 0 || end >= 0) {
        mpp_err_f("found memory %p size %d caller %s overwrite from %d to %d\n",
                  node_ptr, size, node->caller, start, end);
        dump(node->caller);
    }

    return end - start;
}